

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalPredictiveEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  uint uVar1;
  int iVar2;
  CornerTable *pCVar3;
  pointer piVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  this->num_symbols_ = this->num_symbols_ + 1;
  uVar1 = (this->last_corner_).value_;
  uVar7 = (ulong)uVar1;
  uVar8 = 0xffffffff;
  uVar9 = 0xffffffff;
  uVar10 = uVar9;
  uVar5 = uVar9;
  if (uVar7 != 0xffffffff) {
    uVar10 = uVar1 - 2;
    if ((uVar1 + 1) % 3 != 0) {
      uVar10 = uVar1 + 1;
    }
    if (uVar1 % 3 == 0) {
      uVar5 = uVar1 + 2;
    }
    else {
      uVar5 = uVar1 - 1;
    }
  }
  switch(symbol) {
  case TOPOLOGY_C:
    uVar7 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar7 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    iVar2 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    uVar9 = 9;
    if (-1 < iVar2) {
      uVar9 = (uint)(iVar2 < 6) * 5;
    }
  case TOPOLOGY_S:
    pCVar3 = this->corner_table_;
    uVar7 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar7 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    piVar4 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4[uVar7] = piVar4[uVar7] + -1;
    uVar7 = 0xffffffff;
    if (uVar5 != 0xffffffff) {
      uVar7 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
    }
    piVar4[uVar7] = piVar4[uVar7] + -1;
    if (symbol == TOPOLOGY_S) {
      uVar7 = (ulong)(this->last_corner_).value_;
      if (uVar7 != 0xffffffff) {
        uVar8 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
      }
      piVar4[uVar8] = -1;
      this->num_split_symbols_ = this->num_split_symbols_ + 1;
    }
    if (uVar9 != 0xffffffff) {
LAB_00135a1a:
      if (uVar9 == this->prev_symbol_) {
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->predictions_,true);
        goto LAB_00135aaa;
      }
      if (this->prev_symbol_ != 0xffffffff) {
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->predictions_,false);
      }
    }
    break;
  case TOPOLOGY_L:
    pCVar3 = this->corner_table_;
    uVar6 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar6 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar4 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4[uVar6] = piVar4[uVar6] + -1;
    uVar7 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar7 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    piVar4[uVar7] = piVar4[uVar7] + -2;
    if (uVar5 != 0xffffffff) {
      uVar8 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
    }
    piVar4[uVar8] = piVar4[uVar8] + -1;
    break;
  case TOPOLOGY_R:
    pCVar3 = this->corner_table_;
    uVar6 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar6 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    piVar4 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 9;
    if (-1 < piVar4[uVar6]) {
      uVar9 = (uint)(piVar4[uVar6] < 6) * 5;
    }
    uVar6 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar6 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar4[uVar6] = piVar4[uVar6] + -1;
    uVar7 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar7 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    piVar4[uVar7] = piVar4[uVar7] + -1;
    if (uVar5 != 0xffffffff) {
      uVar8 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
    }
    piVar4[uVar8] = piVar4[uVar8] + -2;
    goto LAB_00135a1a;
  case TOPOLOGY_E:
    pCVar3 = this->corner_table_;
    uVar6 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar6 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar4 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4[uVar6] = piVar4[uVar6] + -2;
    uVar7 = 0xffffffff;
    if (uVar10 != 0xffffffff) {
      uVar7 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
    }
    piVar4[uVar7] = piVar4[uVar7] + -2;
    if (uVar5 != 0xffffffff) {
      uVar8 = (ulong)(pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
    }
    piVar4[uVar8] = piVar4[uVar8] + -2;
  }
  if (this->prev_symbol_ != ~TOPOLOGY_C) {
    MeshEdgebreakerTraversalEncoder::EncodeSymbol
              (&this->super_MeshEdgebreakerTraversalEncoder,this->prev_symbol_);
  }
LAB_00135aaa:
  this->prev_symbol_ = symbol;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh. And compute the predicted preceding symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh. Adding a new symbol either reduces valences on the vertices or
    // leaves the valence unchanged.
    int32_t predicted_symbol = -1;
    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, mark its tip vertex as invalid by
          // setting the valence to a negative value. Any prediction that will
          // use this vertex will then cause a misprediction. This is currently
          // necessary because the decoding works in the reverse direction and
          // the decoder doesn't know about these vertices until the split
          // symbol is decoded at which point two vertices are merged into one.
          // This can be most likely solved on the encoder side by splitting the
          // tip vertex into two, but since split symbols are relatively rare,
          // it's probably not worth doing it.
          vertex_valences_[corner_table_->Vertex(last_corner_).value()] = -1;
          ++num_split_symbols_;
        }
        break;
      case TOPOLOGY_R:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        // Update valences.
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      default:
        break;
    }
    // Flag used when it's necessary to explicitly store the previous symbol.
    bool store_prev_symbol = true;
    if (predicted_symbol != -1) {
      if (predicted_symbol == prev_symbol_) {
        predictions_.push_back(true);
        store_prev_symbol = false;
      } else if (prev_symbol_ != -1) {
        predictions_.push_back(false);
      }
    }
    if (store_prev_symbol && prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    prev_symbol_ = symbol;
  }